

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDebugLine.h
# Opt level: O2

bool llvm::DWARFDebugLine::Sequence::orderByHighPC(Sequence *LHS,Sequence *RHS)

{
  bool bVar1;
  tuple<const_unsigned_long_&,_const_unsigned_long_&> local_28;
  tuple<const_unsigned_long_&,_const_unsigned_long_&> local_18;
  
  local_28.super__Tuple_impl<0UL,_const_unsigned_long_&,_const_unsigned_long_&>.
  super__Head_base<0UL,_const_unsigned_long_&,_false>._M_head_impl = &LHS->SectionIndex;
  local_28.super__Tuple_impl<0UL,_const_unsigned_long_&,_const_unsigned_long_&>.
  super__Tuple_impl<1UL,_const_unsigned_long_&>.super__Head_base<1UL,_const_unsigned_long_&,_false>.
  _M_head_impl = (_Head_base<1UL,_const_unsigned_long_&,_false>)&LHS->HighPC;
  local_18.super__Tuple_impl<0UL,_const_unsigned_long_&,_const_unsigned_long_&>.
  super__Head_base<0UL,_const_unsigned_long_&,_false>._M_head_impl = &RHS->SectionIndex;
  local_18.super__Tuple_impl<0UL,_const_unsigned_long_&,_const_unsigned_long_&>.
  super__Tuple_impl<1UL,_const_unsigned_long_&>.super__Head_base<1UL,_const_unsigned_long_&,_false>.
  _M_head_impl = (_Head_base<1UL,_const_unsigned_long_&,_false>)&RHS->HighPC;
  bVar1 = std::
          __tuple_compare<std::tuple<const_unsigned_long_&,_const_unsigned_long_&>,_std::tuple<const_unsigned_long_&,_const_unsigned_long_&>,_0UL,_2UL>
          ::__less(&local_28,&local_18);
  return bVar1;
}

Assistant:

static bool orderByHighPC(const Sequence &LHS, const Sequence &RHS) {
      return std::tie(LHS.SectionIndex, LHS.HighPC) <
             std::tie(RHS.SectionIndex, RHS.HighPC);
    }